

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void HashmapNodeLink(jx9_hashmap *pMap,jx9_hashmap_node *pNode,sxu32 nBucketIdx)

{
  sxu32 nBucketIdx_local;
  jx9_hashmap_node *pNode_local;
  jx9_hashmap *pMap_local;
  
  if (pMap->apBucket[nBucketIdx] != (jx9_hashmap_node *)0x0) {
    pNode->pNextCollide = pMap->apBucket[nBucketIdx];
    pMap->apBucket[nBucketIdx]->pPrevCollide = pNode;
  }
  pMap->apBucket[nBucketIdx] = pNode;
  if (pMap->pFirst == (jx9_hashmap_node *)0x0) {
    pMap->pLast = pNode;
    pMap->pFirst = pNode;
    pMap->pCur = pNode;
  }
  else if (pMap->pLast == (jx9_hashmap_node *)0x0) {
    pMap->pLast = pNode;
  }
  else {
    pNode->pNext = pMap->pLast;
    pMap->pLast->pPrev = pNode;
    pMap->pLast = pNode;
  }
  pMap->nEntry = pMap->nEntry + 1;
  return;
}

Assistant:

static void HashmapNodeLink(jx9_hashmap *pMap, jx9_hashmap_node *pNode, sxu32 nBucketIdx)
{
	/* Link */
	if( pMap->apBucket[nBucketIdx] != 0 ){
		pNode->pNextCollide = pMap->apBucket[nBucketIdx];
		pMap->apBucket[nBucketIdx]->pPrevCollide = pNode;
	}
	pMap->apBucket[nBucketIdx] = pNode;
	/* Link to the map list */
	if( pMap->pFirst == 0 ){
		pMap->pFirst = pMap->pLast = pNode;
		/* Point to the first inserted node */
		pMap->pCur = pNode;
	}else{
		MACRO_LD_PUSH(pMap->pLast, pNode);
	}
	++pMap->nEntry;
}